

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64.hpp
# Opt level: O2

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,status_type *S)

{
  undefined4 uVar1;
  long lVar2;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  wistream *in_00;
  long lVar4;
  status_type S_new;
  delim_c local_2a;
  delim_c local_29;
  result_type local_28;
  
  local_28 = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_29.c = '(';
  pbVar3 = utility::operator>>(in,&local_29);
  in_00 = std::wistream::_M_extract<unsigned_long>((ulong *)pbVar3);
  local_2a.c = ')';
  utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)in_00,&local_2a);
  lVar2 = *(long *)in;
  lVar4 = *(long *)(lVar2 + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    S->r = local_28;
    lVar4 = *(long *)(lVar2 + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.r >> utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }